

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O3

void __thiscall FParser::OPminus(FParser *this,svalue_t *result,int start,int n,int stop)

{
  int iVar1;
  int iVar2;
  svalue_t right;
  svalue_t left;
  svalue_t local_60;
  svalue_t local_48;
  
  local_48.string.Chars = FString::NullString.Nothing;
  local_48.type = 1;
  local_48.value.i = 0;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  local_60.string.Chars = FString::NullString.Nothing;
  local_60.type = 1;
  local_60.value.i = 0;
  if (start != n) {
    EvaluateExpression(this,&local_48,start,n + -1);
    start = n;
  }
  EvaluateExpression(this,&local_60,start + 1,stop);
  if ((local_48.type == 6) || (local_60.type == 6)) {
    result->type = 6;
    iVar1 = fixedvalue(&local_48);
    iVar2 = fixedvalue(&local_60);
  }
  else {
    result->type = 1;
    iVar1 = intvalue(&local_48);
    iVar2 = intvalue(&local_60);
  }
  (result->value).i = iVar1 - iVar2;
  FString::~FString(&local_60.string);
  FString::~FString(&local_48.string);
  return;
}

Assistant:

void FParser::OPminus(svalue_t &result, int start, int n, int stop)
{
	svalue_t left, right;
	
	// do they mean minus as in '-1' rather than '2-1'?
	if(start == n)
	{
		// kinda hack, hehe
		EvaluateExpression(right, n+1, stop);
	}
	else
	{
		evaluate_leftnright(start, n, stop);
	}
	
	// haleyjd: 8-17
	if(left.type == svt_fixed || right.type == svt_fixed)
	{
		result.type = svt_fixed;
		result.value.f = fixedvalue(left) - fixedvalue(right);
	}
	else
	{
		result.type = svt_int;
		result.value.i = intvalue(left) - intvalue(right);
	}
}